

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O1

REF_STATUS
ref_part_bin_ugrid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename,
                  REF_BOOL swap_endian,REF_BOOL sixty_four_bit)

{
  REF_GRID ref_grid;
  uint uVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  byte bVar4;
  undefined8 uVar5;
  long lVar6;
  undefined4 in_register_00000084;
  char *pcVar7;
  REF_INT single;
  char local_8d;
  int local_8c;
  ulong local_88;
  REF_LONG nnode;
  REF_LONG nqua;
  REF_LONG ntri;
  REF_NODE local_68;
  REF_LONG ntet;
  undefined8 local_58;
  REF_LONG npyr;
  uint local_44;
  REF_LONG npri;
  REF_LONG nhex;
  
  local_58 = CONCAT44(in_register_00000084,sixty_four_bit);
  iVar2 = ref_mpi->timing;
  local_44 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (local_44 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x53f,
           "ref_part_bin_ugrid",(ulong)local_44,"create grid");
    return local_44;
  }
  ref_grid = *ref_grid_ptr;
  local_68 = ref_grid->node;
  local_8d = iVar2 < 1;
  local_88 = (ulong)(uint)swap_endian;
  if (0 < iVar2) {
    ref_mpi_stopwatch_start(ref_grid->mpi);
  }
  uVar5 = local_58;
  local_8c = iVar2;
  if (ref_grid->mpi->id == 0) {
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x54b,
             "ref_part_bin_ugrid","unable to open file");
      return 2;
    }
    if ((int)uVar5 == 0) {
      sVar3 = fread(&single,4,1,__stream);
      if (sVar3 == 1) {
        if ((int)local_88 != 0) {
          single = (uint)single >> 0x18 | (single & 0xff0000U) >> 8 | (single & 0xff00U) << 8 |
                   single << 0x18;
        }
        nnode = (REF_LONG)single;
        sVar3 = fread(&single,4,1,__stream);
        if (sVar3 == 1) {
          if ((int)local_88 != 0) {
            single = (uint)single >> 0x18 | (single & 0xff0000U) >> 8 | (single & 0xff00U) << 8 |
                     single << 0x18;
          }
          ntri = (REF_LONG)single;
          sVar3 = fread(&single,4,1,__stream);
          if (sVar3 == 1) {
            if ((int)local_88 != 0) {
              single = (uint)single >> 0x18 | (single & 0xff0000U) >> 8 | (single & 0xff00U) << 8 |
                       single << 0x18;
            }
            nqua = (REF_LONG)single;
            sVar3 = fread(&single,4,1,__stream);
            if (sVar3 == 1) {
              if ((int)local_88 != 0) {
                single = (uint)single >> 0x18 | (single & 0xff0000U) >> 8 | (single & 0xff00U) << 8
                         | single << 0x18;
              }
              ntet = (REF_LONG)single;
              sVar3 = fread(&single,4,1,__stream);
              if (sVar3 == 1) {
                if ((int)local_88 != 0) {
                  single = (uint)single >> 0x18 | (single & 0xff0000U) >> 8 |
                           (single & 0xff00U) << 8 | single << 0x18;
                }
                npyr = (REF_LONG)single;
                sVar3 = fread(&single,4,1,__stream);
                if (sVar3 == 1) {
                  if ((int)local_88 != 0) {
                    single = (uint)single >> 0x18 | (single & 0xff0000U) >> 8 |
                             (single & 0xff00U) << 8 | single << 0x18;
                  }
                  npri = (REF_LONG)single;
                  sVar3 = fread(&single,4,1,__stream);
                  if (sVar3 == 1) {
                    if ((int)local_88 != 0) {
                      single = (uint)single >> 0x18 | (single & 0xff0000U) >> 8 |
                               (single & 0xff00U) << 8 | single << 0x18;
                    }
                    nhex = (REF_LONG)single;
                    goto LAB_0018bbd9;
                  }
                  pcVar7 = "nhex";
                  uVar5 = 0x572;
                }
                else {
                  pcVar7 = "npri";
                  uVar5 = 0x56f;
                }
              }
              else {
                pcVar7 = "npyr";
                uVar5 = 0x56c;
              }
            }
            else {
              pcVar7 = "ntet";
              uVar5 = 0x569;
            }
          }
          else {
            pcVar7 = "nqua";
            uVar5 = 0x566;
          }
        }
        else {
          pcVar7 = "ntri";
          uVar5 = 0x563;
        }
      }
      else {
        pcVar7 = "nnode";
        uVar5 = 0x560;
      }
    }
    else {
      sVar3 = fread(&nnode,8,1,__stream);
      if (sVar3 == 1) {
        sVar3 = fread(&ntri,8,1,__stream);
        if (sVar3 == 1) {
          sVar3 = fread(&nqua,8,1,__stream);
          if (sVar3 == 1) {
            sVar3 = fread(&ntet,8,1,__stream);
            if (sVar3 == 1) {
              sVar3 = fread(&npyr,8,1,__stream);
              if (sVar3 == 1) {
                sVar3 = fread(&npri,8,1,__stream);
                if (sVar3 == 1) {
                  sVar3 = fread(&nhex,8,1,__stream);
                  if (sVar3 == 1) {
                    if ((int)local_88 != 0) {
                      nnode = (ulong)nnode >> 0x38 | (nnode & 0xff000000000000U) >> 0x28 |
                              (nnode & 0xff0000000000U) >> 0x18 | (nnode & 0xff00000000U) >> 8 |
                              (nnode & 0xff000000U) << 8 | (nnode & 0xff0000U) << 0x18 |
                              (nnode & 0xff00U) << 0x28 | nnode << 0x38;
                      ntri = (ulong)ntri >> 0x38 | (ntri & 0xff000000000000U) >> 0x28 |
                             (ntri & 0xff0000000000U) >> 0x18 | (ntri & 0xff00000000U) >> 8 |
                             (ntri & 0xff000000U) << 8 | (ntri & 0xff0000U) << 0x18 |
                             (ntri & 0xff00U) << 0x28 | ntri << 0x38;
                      nqua = (ulong)nqua >> 0x38 | (nqua & 0xff000000000000U) >> 0x28 |
                             (nqua & 0xff0000000000U) >> 0x18 | (nqua & 0xff00000000U) >> 8 |
                             (nqua & 0xff000000U) << 8 | (nqua & 0xff0000U) << 0x18 |
                             (nqua & 0xff00U) << 0x28 | nqua << 0x38;
                      ntet = (ulong)ntet >> 0x38 | (ntet & 0xff000000000000U) >> 0x28 |
                             (ntet & 0xff0000000000U) >> 0x18 | (ntet & 0xff00000000U) >> 8 |
                             (ntet & 0xff000000U) << 8 | (ntet & 0xff0000U) << 0x18 |
                             (ntet & 0xff00U) << 0x28 | ntet << 0x38;
                      npyr = (ulong)npyr >> 0x38 | (npyr & 0xff000000000000U) >> 0x28 |
                             (npyr & 0xff0000000000U) >> 0x18 | (npyr & 0xff00000000U) >> 8 |
                             (npyr & 0xff000000U) << 8 | (npyr & 0xff0000U) << 0x18 |
                             (npyr & 0xff00U) << 0x28 | npyr << 0x38;
                      npri = (ulong)npri >> 0x38 | (npri & 0xff000000000000U) >> 0x28 |
                             (npri & 0xff0000000000U) >> 0x18 | (npri & 0xff00000000U) >> 8 |
                             (npri & 0xff000000U) << 8 | (npri & 0xff0000U) << 0x18 |
                             (npri & 0xff00U) << 0x28 | npri << 0x38;
                      nhex = (ulong)nhex >> 0x38 | (nhex & 0xff000000000000U) >> 0x28 |
                             (nhex & 0xff0000000000U) >> 0x18 | (nhex & 0xff00000000U) >> 8 |
                             (nhex & 0xff000000U) << 8 | (nhex & 0xff0000U) << 0x18 |
                             (nhex & 0xff00U) << 0x28 | nhex << 0x38;
                    }
                    goto LAB_0018bbd9;
                  }
                  pcVar7 = "nhex";
                  uVar5 = 0x554;
                }
                else {
                  pcVar7 = "npri";
                  uVar5 = 0x553;
                }
              }
              else {
                pcVar7 = "npyr";
                uVar5 = 0x552;
              }
            }
            else {
              pcVar7 = "ntet";
              uVar5 = 0x551;
            }
          }
          else {
            pcVar7 = "nqua";
            uVar5 = 0x550;
          }
        }
        else {
          pcVar7 = "ntri";
          uVar5 = 0x54f;
        }
      }
      else {
        pcVar7 = "nnode";
        uVar5 = 0x54e;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar5,
           "ref_part_bin_ugrid",pcVar7);
    uVar1 = 1;
  }
  else {
    __stream = (FILE *)0x0;
LAB_0018bbd9:
    uVar1 = ref_mpi_bcast(ref_grid->mpi,&nnode,1,2);
    if (uVar1 == 0) {
      uVar1 = ref_mpi_bcast(ref_grid->mpi,&ntri,1,2);
      if (uVar1 == 0) {
        uVar1 = ref_mpi_bcast(ref_grid->mpi,&nqua,1,2);
        if (uVar1 == 0) {
          uVar1 = ref_mpi_bcast(ref_grid->mpi,&ntet,1,2);
          if (uVar1 == 0) {
            uVar1 = ref_mpi_bcast(ref_grid->mpi,&npyr,1,2);
            if (uVar1 == 0) {
              uVar1 = ref_mpi_bcast(ref_grid->mpi,&npri,1,2);
              if (uVar1 == 0) {
                uVar1 = ref_mpi_bcast(ref_grid->mpi,&nhex,1,2);
                if (uVar1 == 0) {
                  if (0 < local_8c) {
                    ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid header");
                  }
                  uVar1 = ref_part_node((FILE *)__stream,(REF_BOOL)local_88,0,0,local_68,nnode);
                  if (uVar1 == 0) {
                    if (0 < local_8c) {
                      ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid nodes");
                    }
                    if (0 < ntri) {
                      iVar2 = (int)local_58;
                      lVar6 = nnode * 0x18 + 0x38;
                      if (iVar2 == 0) {
                        lVar6 = nnode * 0x18 + 0x1c;
                      }
                      bVar4 = iVar2 == 0 ^ 3;
                      uVar1 = ref_part_bin_ugrid_cell
                                        (ref_grid->cell[3],ntri,local_68,nnode,(FILE *)__stream,
                                         lVar6,((nqua << 2) << bVar4) + (ntri * 3 << bVar4) + lVar6,
                                         (REF_BOOL)local_88,iVar2);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x58f,"ref_part_bin_ugrid",(ulong)uVar1,"tri");
                        return uVar1;
                      }
                    }
                    if (0 < nqua) {
                      iVar2 = (int)local_58;
                      lVar6 = nnode * 0x18 + 0x38;
                      if (iVar2 == 0) {
                        lVar6 = nnode * 0x18 + 0x1c;
                      }
                      bVar4 = iVar2 == 0 ^ 3;
                      uVar1 = ref_part_bin_ugrid_cell
                                        (ref_grid->cell[6],nqua,local_68,nnode,(FILE *)__stream,
                                         (ntri * 3 << bVar4) + lVar6,
                                         (nqua * 4 << bVar4) + lVar6 + ((ntri << 2) << bVar4),
                                         (REF_BOOL)local_88,iVar2);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x59b,"ref_part_bin_ugrid",(ulong)uVar1,"qua");
                        return uVar1;
                      }
                    }
                    if (0 < local_8c) {
                      ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid bound");
                    }
                    if (0 < ntet) {
                      iVar2 = (int)local_58;
                      lVar6 = nnode * 0x18 + 0x38;
                      if (iVar2 == 0) {
                        lVar6 = nnode * 0x18 + 0x1c;
                      }
                      bVar4 = iVar2 == 0 ^ 3;
                      uVar1 = ref_part_bin_ugrid_cell
                                        (ref_grid->cell[8],ntet,local_68,nnode,(FILE *)__stream,
                                         (nqua * 5 << bVar4) + ((ntri << 2) << bVar4) + lVar6,-1,
                                         (REF_BOOL)local_88,iVar2);
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x5a7,"ref_part_bin_ugrid",(ulong)uVar1,"tet");
                        return uVar1;
                      }
                    }
                    if (0 < local_8c) {
                      ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid tet");
                    }
                    if (0 < npyr) {
                      iVar2 = (int)local_58;
                      lVar6 = nnode * 0x18 + 0x38;
                      if (iVar2 == 0) {
                        lVar6 = nnode * 0x18 + 0x1c;
                      }
                      bVar4 = iVar2 == 0 ^ 3;
                      uVar1 = ref_part_bin_ugrid_cell
                                        (ref_grid->cell[9],npyr,local_68,nnode,(FILE *)__stream,
                                         ((ntet << 2) << bVar4) + (nqua * 5 << bVar4) +
                                         ((ntri << 2) << bVar4) + lVar6,-1,(REF_BOOL)local_88,iVar2)
                      ;
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x5b3,"ref_part_bin_ugrid",(ulong)uVar1,"pyr");
                        return uVar1;
                      }
                    }
                    if (0 < local_8c) {
                      ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid pyr");
                    }
                    if (0 < npri) {
                      iVar2 = (int)local_58;
                      lVar6 = nnode * 0x18 + 0x38;
                      if (iVar2 == 0) {
                        lVar6 = nnode * 0x18 + 0x1c;
                      }
                      bVar4 = iVar2 == 0 ^ 3;
                      uVar1 = ref_part_bin_ugrid_cell
                                        (ref_grid->cell[10],npri,local_68,nnode,(FILE *)__stream,
                                         (npyr * 5 << bVar4) +
                                         ((ntet << 2) << bVar4) + (nqua * 5 << bVar4) +
                                         ((ntri << 2) << bVar4) + lVar6,-1,(REF_BOOL)local_88,iVar2)
                      ;
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x5c0,"ref_part_bin_ugrid",(ulong)uVar1,"pri");
                        return uVar1;
                      }
                    }
                    if (0 < local_8c) {
                      ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid pri");
                    }
                    if (0 < nhex) {
                      iVar2 = (int)local_58;
                      lVar6 = nnode * 0x18 + 0x38;
                      if (iVar2 == 0) {
                        lVar6 = nnode * 0x18 + 0x1c;
                      }
                      bVar4 = iVar2 == 0 ^ 3;
                      uVar1 = ref_part_bin_ugrid_cell
                                        (ref_grid->cell[0xb],nhex,local_68,nnode,(FILE *)__stream,
                                         (npri * 6 << bVar4) + (npyr * 5 << bVar4) +
                                         ((ntet << 2) << bVar4) + (nqua * 5 << bVar4) +
                                         ((ntri << 2) << bVar4) + lVar6,-1,(REF_BOOL)local_88,iVar2)
                      ;
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x5ce,"ref_part_bin_ugrid",(ulong)uVar1,"hex");
                        return uVar1;
                      }
                    }
                    if (0 < local_8c) {
                      ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid hex");
                    }
                    if ((ref_grid->mpi->id == 0) && (iVar2 = fclose(__stream), iVar2 != 0)) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x5d2,"ref_part_bin_ugrid","close file",0,(long)iVar2);
                      uVar1 = 1;
                    }
                    else {
                      uVar1 = ref_node_ghost_real(local_68);
                      if (uVar1 == 0) {
                        if (0 < local_8c) {
                          ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid ghost");
                        }
                        uVar1 = ref_grid_inward_boundary_orientation(ref_grid);
                        if (uVar1 == 0) {
                          uVar1 = 0;
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x5da,"ref_part_bin_ugrid",(ulong)uVar1,
                                 "inward boundary orientation");
                          local_8d = '\x01';
                        }
                        if (local_8d == '\0') {
                          ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid volume");
                          uVar1 = 0;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x5d6,"ref_part_bin_ugrid",(ulong)uVar1,"ghost real");
                      }
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x584,"ref_part_bin_ugrid",(ulong)uVar1,"part node");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x57e,"ref_part_bin_ugrid",(ulong)uVar1,"bcast");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x57d,"ref_part_bin_ugrid",(ulong)uVar1,"bcast");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x57c,"ref_part_bin_ugrid",(ulong)uVar1,"bcast");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x57b,"ref_part_bin_ugrid",(ulong)uVar1,"bcast");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x57a,"ref_part_bin_ugrid",(ulong)uVar1,"bcast");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x579,"ref_part_bin_ugrid",(ulong)uVar1,"bcast");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x578,
             "ref_part_bin_ugrid",(ulong)uVar1,"bcast");
    }
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_part_bin_ugrid(REF_GRID *ref_grid_ptr,
                                             REF_MPI ref_mpi,
                                             const char *filename,
                                             REF_BOOL swap_endian,
                                             REF_BOOL sixty_four_bit) {
  FILE *file;
  REF_LONG nnode, ntri, nqua, ntet, npyr, npri, nhex;

  REF_FILEPOS conn_offset, faceid_offset;

  REF_GRID ref_grid;
  REF_NODE ref_node;

  REF_INT version = 0;
  REF_BOOL instrument = (ref_mpi_timing(ref_mpi) > 0);

  REF_INT single;
  REF_FILEPOS ibyte;
  ibyte = (sixty_four_bit ? 8 : 4);

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  if (instrument) ref_mpi_stopwatch_start(ref_grid_mpi(ref_grid));

  /* header */

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    if (sixty_four_bit) {
      RES(1, fread(&nnode, sizeof(REF_LONG), 1, file), "nnode");
      RES(1, fread(&ntri, sizeof(REF_LONG), 1, file), "ntri");
      RES(1, fread(&nqua, sizeof(REF_LONG), 1, file), "nqua");
      RES(1, fread(&ntet, sizeof(REF_LONG), 1, file), "ntet");
      RES(1, fread(&npyr, sizeof(REF_LONG), 1, file), "npyr");
      RES(1, fread(&npri, sizeof(REF_LONG), 1, file), "npri");
      RES(1, fread(&nhex, sizeof(REF_LONG), 1, file), "nhex");

      if (swap_endian) {
        SWAP_LONG(nnode);
        SWAP_LONG(ntri);
        SWAP_LONG(nqua);
        SWAP_LONG(ntet);
        SWAP_LONG(npyr);
        SWAP_LONG(npri);
        SWAP_LONG(nhex);
      }
    } else {
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "nnode");
      if (swap_endian) SWAP_INT(single);
      nnode = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "ntri");
      if (swap_endian) SWAP_INT(single);
      ntri = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "nqua");
      if (swap_endian) SWAP_INT(single);
      nqua = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "ntet");
      if (swap_endian) SWAP_INT(single);
      ntet = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "npyr");
      if (swap_endian) SWAP_INT(single);
      npyr = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "npri");
      if (swap_endian) SWAP_INT(single);
      npri = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "nhex");
      if (swap_endian) SWAP_INT(single);
      nhex = single;
    }
  }

  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &nnode, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &ntri, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &nqua, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &ntet, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &npyr, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &npri, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &nhex, 1, REF_LONG_TYPE), "bcast");

  if (instrument)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid header");

  RSS(ref_part_node(file, swap_endian, version, REF_FALSE, ref_node, nnode),
      "part node");
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid nodes");

  if (0 < ntri) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3);
    faceid_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                    (REF_FILEPOS)ntri * 3 * ibyte +
                    (REF_FILEPOS)nqua * 4 * ibyte;
    RSS(ref_part_bin_ugrid_cell(ref_grid_tri(ref_grid), ntri, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "tri");
  }

  if (0 < nqua) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                  (REF_FILEPOS)ntri * 3 * ibyte;
    faceid_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                    (REF_FILEPOS)ntri * 4 * ibyte +
                    (REF_FILEPOS)nqua * 4 * ibyte;
    RSS(ref_part_bin_ugrid_cell(ref_grid_qua(ref_grid), nqua, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "qua");
  }

  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid bound");

  if (0 < ntet) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                  (REF_FILEPOS)ntri * 4 * ibyte + (REF_FILEPOS)nqua * 5 * ibyte;
    faceid_offset = (REF_FILEPOS)REF_EMPTY;
    RSS(ref_part_bin_ugrid_cell(ref_grid_tet(ref_grid), ntet, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "tet");
  }
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid tet");

  if (0 < npyr) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                  (REF_FILEPOS)ntri * 4 * ibyte +
                  (REF_FILEPOS)nqua * 5 * ibyte + (REF_FILEPOS)ntet * 4 * ibyte;
    faceid_offset = (REF_FILEPOS)REF_EMPTY;
    RSS(ref_part_bin_ugrid_cell(ref_grid_pyr(ref_grid), npyr, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "pyr");
  }
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid pyr");

  if (0 < npri) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                  (REF_FILEPOS)ntri * 4 * ibyte +
                  (REF_FILEPOS)nqua * 5 * ibyte +
                  (REF_FILEPOS)ntet * 4 * ibyte + (REF_FILEPOS)npyr * 5 * ibyte;
    faceid_offset = (REF_FILEPOS)REF_EMPTY;
    RSS(ref_part_bin_ugrid_cell(ref_grid_pri(ref_grid), npri, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "pri");
  }
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid pri");

  if (0 < nhex) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                  (REF_FILEPOS)ntri * 4 * ibyte +
                  (REF_FILEPOS)nqua * 5 * ibyte +
                  (REF_FILEPOS)ntet * 4 * ibyte +
                  (REF_FILEPOS)npyr * 5 * ibyte + (REF_FILEPOS)npri * 6 * ibyte;
    faceid_offset = REF_EMPTY;
    RSS(ref_part_bin_ugrid_cell(ref_grid_hex(ref_grid), nhex, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "hex");
  }
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid hex");

  if (ref_grid_once(ref_grid)) REIS(0, fclose(file), "close file");

  /* ghost xyz */

  RSS(ref_node_ghost_real(ref_node), "ghost real");
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid ghost");

  RSS(ref_grid_inward_boundary_orientation(ref_grid),
      "inward boundary orientation");

  if (instrument)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid volume");

  return REF_SUCCESS;
}